

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvolutionFilter.cpp
# Opt level: O1

void __thiscall
Rml::ConvolutionFilter::Run
          (ConvolutionFilter *this,byte *destination,Vector2i destination_dimensions,
          int destination_stride,ColorFormat destination_color_format,byte *source,
          Vector2i source_dimensions,Vector2i source_offset,ColorFormat source_color_format)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  ulong local_b8;
  ulong local_b0;
  
  if (0 < destination_dimensions.y) {
    iVar6 = (this->kernel_size).x;
    iVar11 = (this->kernel_size).y;
    iVar6 = (iVar6 - (iVar6 + -1 >> 0x1f)) + -1 >> 1;
    iVar11 = -(source_offset.y + ((iVar11 - (iVar11 + -1 >> 0x1f)) + -1 >> 1));
    local_b0 = (ulong)(uint)((source_dimensions.x * iVar11 - iVar6) - source_offset.x);
    local_b8 = 0;
    do {
      if (0 < destination_dimensions.x) {
        uVar10 = 0;
        uVar4 = local_b0;
        iVar5 = -(iVar6 + source_offset.x);
        do {
          lVar7 = (long)(this->kernel_size).y;
          if (lVar7 < 1) {
            fVar13 = 0.0;
          }
          else {
            uVar2 = (this->kernel_size).x;
            fVar13 = 0.0;
            uVar8 = 0;
            lVar12 = 0;
            uVar3 = uVar4;
            do {
              if (0 < (int)uVar2) {
                lVar1 = lVar12 + (iVar11 + (int)local_b8);
                uVar9 = 0;
                do {
                  if ((((-1 < lVar1) && (lVar1 < (long)source_dimensions >> 0x20)) &&
                      (-1 < (long)((long)iVar5 + uVar9))) &&
                     ((long)((long)iVar5 + uVar9) < (long)source_dimensions.x)) {
                    fVar14 = (float)source[(ulong)(uint)((int)uVar3 + (int)uVar9 <<
                                                        (source_color_format == RGBA8) * '\x02') +
                                           (ulong)((uint)(source_color_format == RGBA8) * 3)] *
                             (this->kernel)._M_t.
                             super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                             super__Head_base<0UL,_float_*,_false>._M_head_impl[uVar8 + uVar9];
                    if (this->operation == Dilation) {
                      if (fVar13 <= fVar14) {
                        fVar13 = fVar14;
                      }
                    }
                    else if (this->operation == Sum) {
                      fVar13 = fVar13 + fVar14;
                    }
                  }
                  uVar9 = uVar9 + 1;
                } while (uVar2 != uVar9);
              }
              lVar12 = lVar12 + 1;
              uVar8 = (ulong)((int)uVar8 + uVar2);
              uVar3 = uVar3 + (long)source_dimensions;
            } while (lVar12 != lVar7);
          }
          fVar14 = 255.0;
          if (fVar13 <= 255.0) {
            fVar14 = fVar13;
          }
          destination
          [(int)(((int)uVar10 << (destination_color_format == RGBA8) * '\x02') +
                (int)local_b8 * destination_stride + (uint)(destination_color_format == RGBA8) * 3)]
               = (byte)(int)fVar14;
          uVar10 = uVar10 + 1;
          iVar5 = iVar5 + 1;
          uVar4 = uVar4 + 1;
        } while (uVar10 != (destination_dimensions.x & 0x7fffffff));
      }
      local_b8 = local_b8 + 1;
      local_b0 = local_b0 + (long)source_dimensions;
    } while (local_b8 != (ulong)destination_dimensions >> 0x20);
  }
  return;
}

Assistant:

void ConvolutionFilter::Run(byte* destination, const Vector2i destination_dimensions, const int destination_stride,
	const ColorFormat destination_color_format, const byte* source, const Vector2i source_dimensions, const Vector2i source_offset,
	const ColorFormat source_color_format) const
{
	RMLUI_ZoneScopedNC("ConvFilter::Run", 0xd6bf49);

	const int destination_bytes_per_pixel = (destination_color_format == ColorFormat::RGBA8 ? 4 : 1);
	const int destination_alpha_offset = (destination_color_format == ColorFormat::RGBA8 ? 3 : 0);
	const int source_bytes_per_pixel = (source_color_format == ColorFormat::RGBA8 ? 4 : 1);
	const int source_alpha_offset = (source_color_format == ColorFormat::RGBA8 ? 3 : 0);

	const Vector2i kernel_radius = (kernel_size - Vector2i(1)) / 2;

	for (int y = 0; y < destination_dimensions.y; ++y)
	{
		for (int x = 0; x < destination_dimensions.x; ++x)
		{
			float opacity = 0.f;

			for (int kernel_y = 0; kernel_y < kernel_size.y; ++kernel_y)
			{
				const int source_y = y - source_offset.y - kernel_radius.y + kernel_y;

				for (int kernel_x = 0; kernel_x < kernel_size.x; ++kernel_x)
				{
					const int source_x = x - source_offset.x - kernel_radius.x + kernel_x;
					if (source_y >= 0 && source_y < source_dimensions.y && source_x >= 0 && source_x < source_dimensions.x)
					{
						const int source_index = (source_y * source_dimensions.x + source_x) * source_bytes_per_pixel + source_alpha_offset;
						const float pixel_opacity = float(source[source_index]) * kernel[kernel_y * kernel_size.x + kernel_x];

						switch (operation)
						{
						case FilterOperation::Sum: opacity += pixel_opacity; break;
						case FilterOperation::Dilation: opacity = Math::Max(opacity, pixel_opacity); break;
						}
					}
				}
			}

			opacity = Math::Min(255.f, opacity);

			const int destination_index = y * destination_stride + x * destination_bytes_per_pixel + destination_alpha_offset;
			destination[destination_index] = byte(opacity);
		}
	}
}